

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

curl_slist * Curl_cookie_list(Curl_easy *data)

{
  CookieInfo *pCVar1;
  char *data_00;
  curl_slist *pcVar2;
  Cookie *co;
  curl_slist *list;
  
  pCVar1 = data->cookies;
  if (pCVar1 == (CookieInfo *)0x0) {
    return (curl_slist *)0x0;
  }
  if ((pCVar1->numcookies == 0) || (co = pCVar1->cookies, co == (Cookie *)0x0)) {
LAB_0010e486:
    pcVar2 = (curl_slist *)0x0;
  }
  else {
    list = (curl_slist *)0x0;
    do {
      pcVar2 = list;
      if (co->domain != (char *)0x0) {
        data_00 = get_netscape_format(co);
        if (data_00 != (char *)0x0) {
          pcVar2 = Curl_slist_append_nodup(list,data_00);
          if (pcVar2 != (curl_slist *)0x0) goto LAB_0010e462;
          (*Curl_cfree)(data_00);
        }
        curl_slist_free_all(list);
        goto LAB_0010e486;
      }
LAB_0010e462:
      co = co->next;
      list = pcVar2;
    } while (co != (Cookie *)0x0);
  }
  return pcVar2;
}

Assistant:

struct curl_slist *Curl_cookie_list(struct Curl_easy *data)
{
  struct curl_slist *list = NULL;
  struct curl_slist *beg;
  struct Cookie *c;
  char *line;

  if((data->cookies == NULL) ||
      (data->cookies->numcookies == 0))
    return NULL;

  for(c = data->cookies->cookies; c; c = c->next) {
    if(!c->domain)
      continue;
    line = get_netscape_format(c);
    if(!line) {
      curl_slist_free_all(list);
      return NULL;
    }
    beg = Curl_slist_append_nodup(list, line);
    if(!beg) {
      free(line);
      curl_slist_free_all(list);
      return NULL;
    }
    list = beg;
  }

  return list;
}